

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::PrintHeapBlockMemoryStats(Recycler *this,char16 *name,HeapBlockType type)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t liveByteCount;
  size_t totalByteCount;
  size_t blockPages;
  size_t partialUnusedBytes;
  size_t allocableFreeByteCount;
  HeapBlockType type_local;
  char16 *name_local;
  Recycler *this_local;
  undefined4 uVar6;
  
  partialUnusedBytes = (this->collectionStats).heapBlockFreeByteCount[type];
  blockPages = 0;
  if ((this->enablePartialCollect & 1U) != 0) {
    blockPages = partialUnusedBytes -
                 (this->collectionStats).smallNonLeafHeapBlockPartialReuseBytes[type];
    partialUnusedBytes = partialUnusedBytes - blockPages;
  }
  lVar1 = 8;
  if (type < MediumNormalBlockType) {
    lVar1 = 1;
  }
  lVar1 = ((this->collectionStats).heapBlockCount[type] -
          (this->collectionStats).heapBlockFreeCount[type]) * lVar1 * 0x1000;
  Output::Print(L" %6s: %10d %10d",name,lVar1 - (this->collectionStats).heapBlockFreeByteCount[type]
                ,partialUnusedBytes);
  if (((this->enablePartialCollect & 1U) == 0) ||
     (((((type != LargeBlockTypeCount && (type != SmallFinalizableBlockType)) &&
        (type != SmallNormalBlockWithBarrierType)) &&
       ((type != MediumAllocBlockTypeCount && (type != MediumNormalBlockType)))) &&
      ((type != MediumFinalizableBlockType &&
       ((type != MediumNormalBlockWithBarrierType && (type != MediumFinalizableBlockWithBarrierType)
        ))))))) {
    Output::Print(L"           ");
  }
  else {
    Output::Print(L" %10d",blockPages);
  }
  auVar2._8_4_ = (int)(partialUnusedBytes >> 0x20);
  auVar2._0_8_ = partialUnusedBytes;
  auVar2._12_4_ = 0x45300000;
  uVar6 = (undefined4)((ulong)lVar1 >> 0x20);
  auVar4._8_4_ = uVar6;
  auVar4._0_8_ = lVar1;
  auVar4._12_4_ = 0x45300000;
  Output::Print(L" %10d %6.1f",
                (((auVar2._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)partialUnusedBytes) - 4503599627370496.0)) /
                ((auVar4._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) * 100.0);
  if (((this->enablePartialCollect & 1U) != 0) &&
     ((((type == LargeBlockTypeCount || (type == SmallFinalizableBlockType)) ||
       (type == SmallNormalBlockWithBarrierType)) ||
      (((type == MediumAllocBlockTypeCount || (type == MediumNormalBlockType)) ||
       ((type == MediumFinalizableBlockType ||
        ((type == MediumNormalBlockWithBarrierType ||
         (type == MediumFinalizableBlockWithBarrierType)))))))))) {
    auVar3._8_4_ = (int)(blockPages >> 0x20);
    auVar3._0_8_ = blockPages;
    auVar3._12_4_ = 0x45300000;
    auVar5._8_4_ = uVar6;
    auVar5._0_8_ = lVar1;
    auVar5._12_4_ = 0x45300000;
    Output::Print(L" %6.1f",
                  (((auVar3._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)blockPages) - 4503599627370496.0)) /
                  ((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0))) * 100.0);
  }
  return;
}

Assistant:

void
Recycler::PrintHeapBlockMemoryStats(char16 const * name, HeapBlock::HeapBlockType type)
{
    size_t allocableFreeByteCount = collectionStats.heapBlockFreeByteCount[type];
#if ENABLE_PARTIAL_GC
    size_t partialUnusedBytes = 0;
    if (this->enablePartialCollect)
    {
        partialUnusedBytes = allocableFreeByteCount
            - collectionStats.smallNonLeafHeapBlockPartialReuseBytes[type];
        allocableFreeByteCount -= partialUnusedBytes;
    }
#endif
    size_t blockPages = type < HeapBlock::HeapBlockType::SmallAllocBlockTypeCount ?
        SmallAllocationBlockAttributes::PageCount : MediumAllocationBlockAttributes::PageCount;
    size_t totalByteCount = (collectionStats.heapBlockCount[type] - collectionStats.heapBlockFreeCount[type]) * blockPages * AutoSystemInfo::PageSize;
    size_t liveByteCount = totalByteCount - collectionStats.heapBlockFreeByteCount[type];
    Output::Print(_u(" %6s: %10d %10d"), name, liveByteCount, allocableFreeByteCount);

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect &&
        (type == HeapBlock::HeapBlockType::SmallNormalBlockType
      || type == HeapBlock::HeapBlockType::SmallFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
      || type == HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType
      || type == HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType
#endif
      || type == HeapBlock::HeapBlockType::MediumNormalBlockType
      || type == HeapBlock::HeapBlockType::MediumFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
      || type == HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType
      || type == HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType
#endif
      ))
    {
        Output::Print(_u(" %10d"), partialUnusedBytes);
    }
    else
#endif
    {
        Output::Print(_u("           "));
    }

    Output::Print(_u(" %10d %6.1f"), totalByteCount,
        (double)allocableFreeByteCount / (double)totalByteCount * 100);

#if ENABLE_PARTIAL_GC
    if (this->enablePartialCollect &&
        (type == HeapBlock::HeapBlockType::SmallNormalBlockType
        || type == HeapBlock::HeapBlockType::SmallFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
        || type == HeapBlock::HeapBlockType::SmallNormalBlockWithBarrierType
        || type == HeapBlock::HeapBlockType::SmallFinalizableBlockWithBarrierType
#endif
        || type == HeapBlock::HeapBlockType::MediumNormalBlockType
        || type == HeapBlock::HeapBlockType::MediumFinalizableBlockType
#ifdef RECYCLER_WRITE_BARRIER
        || type == HeapBlock::HeapBlockType::MediumNormalBlockWithBarrierType
        || type == HeapBlock::HeapBlockType::MediumFinalizableBlockWithBarrierType
#endif
        ))
    {
        Output::Print(_u(" %6.1f"), (double)partialUnusedBytes / (double)totalByteCount * 100);
    }
#endif
}